

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O3

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,uchar *tag,size_t tag_len)

{
  uchar *x;
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = -0x14;
  if (0xfffffffffffffff2 < tag_len - 0x11) {
    lVar3 = ctx->len << 3;
    lVar4 = ctx->add_len << 3;
    memcpy(tag,ctx->base_ectr,tag_len);
    iVar5 = 0;
    if (lVar3 != 0 || lVar4 != 0) {
      x = ctx->buf;
      uVar1 = *(ulong *)(ctx->buf + 8);
      *(ulong *)ctx->buf =
           *(ulong *)ctx->buf ^
           CONCAT44(CONCAT22(CONCAT11((char)lVar4,(char)((ulong)lVar4 >> 8)),
                             CONCAT11((char)((ulong)lVar4 >> 0x10),(char)((ulong)lVar4 >> 0x18))),
                    CONCAT22(CONCAT11((char)((ulong)lVar4 >> 0x20),(char)((ulong)lVar4 >> 0x28)),
                             CONCAT11((char)((ulong)lVar4 >> 0x30),(char)((ulong)lVar4 >> 0x38))));
      *(ulong *)(ctx->buf + 8) =
           uVar1 ^ CONCAT44(CONCAT22(CONCAT11((char)lVar3,(char)((ulong)lVar3 >> 8)),
                                     CONCAT11((char)((ulong)lVar3 >> 0x10),
                                              (char)((ulong)lVar3 >> 0x18))),
                            CONCAT22(CONCAT11((char)((ulong)lVar3 >> 0x20),
                                              (char)((ulong)lVar3 >> 0x28)),
                                     CONCAT11((char)((ulong)lVar3 >> 0x30),
                                              (char)((ulong)lVar3 >> 0x38))));
      gcm_mult(ctx,x,x);
      iVar5 = 0;
      if (tag_len != 0) {
        iVar5 = 0;
        sVar2 = 0;
        do {
          tag[sVar2] = tag[sVar2] ^ x[sVar2];
          sVar2 = sVar2 + 1;
        } while (tag_len != sVar2);
      }
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_gcm_finish( mbedtls_gcm_context *ctx,
                unsigned char *tag,
                size_t tag_len )
{
    unsigned char work_buf[16];
    size_t i;
    uint64_t orig_len;
    uint64_t orig_add_len;

    GCM_VALIDATE_RET( ctx != NULL );
    GCM_VALIDATE_RET( tag != NULL );

    orig_len = ctx->len * 8;
    orig_add_len = ctx->add_len * 8;

    if( tag_len > 16 || tag_len < 4 )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    memcpy( tag, ctx->base_ectr, tag_len );

    if( orig_len || orig_add_len )
    {
        memset( work_buf, 0x00, 16 );

        PUT_UINT32_BE( ( orig_add_len >> 32 ), work_buf, 0  );
        PUT_UINT32_BE( ( orig_add_len       ), work_buf, 4  );
        PUT_UINT32_BE( ( orig_len     >> 32 ), work_buf, 8  );
        PUT_UINT32_BE( ( orig_len           ), work_buf, 12 );

        for( i = 0; i < 16; i++ )
            ctx->buf[i] ^= work_buf[i];

        gcm_mult( ctx, ctx->buf, ctx->buf );

        for( i = 0; i < tag_len; i++ )
            tag[i] ^= ctx->buf[i];
    }

    return( 0 );
}